

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpphttplibconnector.hpp
# Opt level: O1

string * __thiscall
CppHttpLibClientConnector::Send
          (string *__return_storage_ptr__,CppHttpLibClientConnector *this,string *request)

{
  JsonRpcException *this_00;
  Result res;
  undefined1 local_88 [32];
  _Base_ptr local_68;
  size_t sStack_60;
  Result local_58;
  
  local_88._24_8_ = local_88 + 8;
  local_88._16_8_ = (_Base_ptr)0x0;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = 0;
  sStack_60 = 0;
  local_68 = (_Base_ptr)local_88._24_8_;
  httplib::ClientImpl::Post
            (&local_58,
             (this->httpClient).cli_._M_t.
             super___uniq_ptr_impl<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>_>.
             _M_t.
             super__Tuple_impl<0UL,_httplib::ClientImpl_*,_std::default_delete<httplib::ClientImpl>_>
             .super__Head_base<0UL,_httplib::ClientImpl_*,_false>._M_head_impl,"/jsonrpc",
             (Headers *)local_88,request,"application/json");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_88);
  if (((_Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>)
       local_58.res_._M_t.
       super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
       super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl != (Response *)0x0) &&
     (*(int *)((long)local_58.res_._M_t.
                     super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                     .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x20) == 200)
     ) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               *(long *)((long)local_58.res_._M_t.
                               super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                               .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl +
                        0x78),
               *(long *)((long)local_58.res_._M_t.
                               super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                               .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl +
                        0x80) +
               *(long *)((long)local_58.res_._M_t.
                               super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                               .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl +
                        0x78));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_58.request_headers_._M_t);
    std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
              (&local_58.res_);
    return __return_storage_ptr__;
  }
  this_00 = (JsonRpcException *)__cxa_allocate_exception(0x60);
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"client connector error, received status != 200","");
  jsonrpccxx::JsonRpcException::JsonRpcException(this_00,-0x7d03,(string *)local_88);
  __cxa_throw(this_00,&jsonrpccxx::JsonRpcException::typeinfo,
              jsonrpccxx::JsonRpcException::~JsonRpcException);
}

Assistant:

std::string Send(const std::string &request) override {
    auto res = httpClient.Post("/jsonrpc", request, "application/json");
    if (!res || res->status != 200) {
      throw jsonrpccxx::JsonRpcException(-32003, "client connector error, received status != 200");
    }
    return res->body;
  }